

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hospital.cpp
# Opt level: O1

Nurse * __thiscall
Hospital::Entered_Nurse
          (Hospital *this,string *username,string *password,
          vector<Nurse,_std::allocator<Nurse>_> *All_Of_Nurses)

{
  int iVar1;
  ulong uVar2;
  long lVar3;
  pointer pNVar4;
  ulong uVar5;
  bool bVar6;
  bool bVar7;
  string local_70;
  string local_50;
  
  pNVar4 = (All_Of_Nurses->super__Vector_base<Nurse,_std::allocator<Nurse>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((All_Of_Nurses->super__Vector_base<Nurse,_std::allocator<Nurse>_>)._M_impl.
      super__Vector_impl_data._M_finish != pNVar4) {
    lVar3 = 0;
    uVar5 = 0;
    do {
      Human::User_name_Getter_abi_cxx11_
                (&local_70,(Human *)((long)&(pNVar4->super_Human).Id._M_dataplus._M_p + lVar3));
      if (local_70._M_string_length == username->_M_string_length) {
        if (local_70._M_string_length == 0) {
          bVar6 = true;
        }
        else {
          iVar1 = bcmp(local_70._M_dataplus._M_p,(username->_M_dataplus)._M_p,
                       local_70._M_string_length);
          bVar6 = iVar1 == 0;
        }
      }
      else {
        bVar6 = false;
      }
      if ((bVar6) &&
         (Human::Password_Getter_abi_cxx11_
                    (&local_50,
                     (Human *)((long)&(((All_Of_Nurses->
                                        super__Vector_base<Nurse,_std::allocator<Nurse>_>)._M_impl.
                                        super__Vector_impl_data._M_start)->super_Human).Id.
                                      _M_dataplus + lVar3)),
         local_50._M_string_length == password->_M_string_length)) {
        if (local_50._M_string_length == 0) {
          bVar7 = true;
        }
        else {
          iVar1 = bcmp(local_50._M_dataplus._M_p,(password->_M_dataplus)._M_p,
                       local_50._M_string_length);
          bVar7 = iVar1 == 0;
        }
      }
      else {
        bVar7 = false;
      }
      if ((bVar6) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2)) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      if (bVar7) goto LAB_0012047e;
      uVar5 = uVar5 + 1;
      pNVar4 = (All_Of_Nurses->super__Vector_base<Nurse,_std::allocator<Nurse>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar2 = ((long)(All_Of_Nurses->super__Vector_base<Nurse,_std::allocator<Nurse>_>)._M_impl.
                     super__Vector_impl_data._M_finish - (long)pNVar4 >> 3) * -0x7d05f417d05f417d;
      lVar3 = lVar3 + 0x158;
    } while (uVar5 <= uVar2 && uVar2 - uVar5 != 0);
  }
  uVar5 = 0;
LAB_0012047e:
  return (All_Of_Nurses->super__Vector_base<Nurse,_std::allocator<Nurse>_>)._M_impl.
         super__Vector_impl_data._M_start + uVar5;
}

Assistant:

Nurse* Hospital :: Entered_Nurse(string username , string password , vector<Nurse> & All_Of_Nurses){
    int g =0;
    for (int i = 0; i < All_Of_Nurses.size(); ++i) {
        if (All_Of_Nurses[i].User_name_Getter() == username && All_Of_Nurses[i].Password_Getter() == password) {
            g = i;
            break;
        }
    }
    return &All_Of_Nurses[g];
}